

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictbe.cpp
# Opt level: O1

int32_t __thiscall
icu_63::PossibleWord::candidates
          (PossibleWord *this,UText *text,DictionaryMatcher *dict,int32_t rangeEnd)

{
  int iVar1;
  int64_t iVar2;
  int iVar3;
  
  iVar2 = utext_getNativeIndex_63(text);
  iVar3 = (int)iVar2;
  if (this->offset != iVar3) {
    this->offset = iVar3;
    iVar1 = (*dict->_vptr_DictionaryMatcher[2])
                      (dict,text,(ulong)(uint)(rangeEnd - iVar3),0x14,this->cuLengths,
                       this->cpLengths,0,&this->prefix);
    this->count = iVar1;
    if (iVar1 < 1) {
      utext_setNativeIndex_63(text,(long)iVar3);
    }
  }
  if (0 < this->count) {
    utext_setNativeIndex_63(text,(long)iVar3 + (long)this->cuLengths[this->count - 1]);
  }
  iVar3 = this->count + -1;
  this->current = iVar3;
  this->mark = iVar3;
  return this->count;
}

Assistant:

int32_t PossibleWord::candidates( UText *text, DictionaryMatcher *dict, int32_t rangeEnd ) {
    // TODO: If getIndex is too slow, use offset < 0 and add discardAll()
    int32_t start = (int32_t)utext_getNativeIndex(text);
    if (start != offset) {
        offset = start;
        count = dict->matches(text, rangeEnd-start, UPRV_LENGTHOF(cuLengths), cuLengths, cpLengths, NULL, &prefix);
        // Dictionary leaves text after longest prefix, not longest word. Back up.
        if (count <= 0) {
            utext_setNativeIndex(text, start);
        }
    }
    if (count > 0) {
        utext_setNativeIndex(text, start+cuLengths[count-1]);
    }
    current = count-1;
    mark = current;
    return count;
}